

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_do_write(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,_Bool flush_all,char *buf
                        ,size_t blen)

{
  CURLcode CVar1;
  ulong local_48;
  size_t consumed;
  size_t sStack_38;
  CURLcode result;
  size_t blen_local;
  char *buf_local;
  _Bool flush_all_local;
  Curl_easy *pCStack_20;
  cw_out_type otype_local;
  Curl_easy *data_local;
  cw_out_ctx *ctx_local;
  
  consumed._4_4_ = 0;
  sStack_38 = blen;
  blen_local = (size_t)buf;
  buf_local._3_1_ = flush_all;
  buf_local._4_4_ = otype;
  pCStack_20 = data;
  data_local = (Curl_easy *)ctx;
  if (((ctx->buf == (cw_out_buf *)0x0) || (ctx->buf->type == otype)) ||
     (CVar1 = cw_out_flush_chain(ctx,data,&ctx->buf,true), CVar1 == CURLE_OK)) {
    consumed._4_4_ = 0;
    if ((data_local->multi_queue)._list == (Curl_llist *)0x0) {
      consumed._4_4_ =
           cw_out_ptr_flush((cw_out_ctx *)data_local,pCStack_20,buf_local._4_4_,
                            (_Bool)(buf_local._3_1_ & 1),(char *)blen_local,sStack_38,&local_48);
      if (consumed._4_4_ != CURLE_OK) {
        return consumed._4_4_;
      }
      CVar1 = CURLE_OK;
      if (local_48 < sStack_38) {
        CVar1 = cw_out_append((cw_out_ctx *)data_local,buf_local._4_4_,
                              (char *)(blen_local + local_48),sStack_38 - local_48);
      }
    }
    else {
      consumed._4_4_ =
           cw_out_append((cw_out_ctx *)data_local,buf_local._4_4_,(char *)blen_local,sStack_38);
      if (consumed._4_4_ != CURLE_OK) {
        return consumed._4_4_;
      }
      CVar1 = cw_out_flush_chain((cw_out_ctx *)data_local,pCStack_20,
                                 (cw_out_buf **)&data_local->multi_queue,
                                 (_Bool)(buf_local._3_1_ & 1));
    }
  }
  consumed._4_4_ = CVar1;
  if (consumed._4_4_ != CURLE_OK) {
    *(byte *)&(data_local->multi_queue)._ptr = *(byte *)&(data_local->multi_queue)._ptr & 0xfd | 2;
    cw_out_bufs_free((cw_out_ctx *)data_local);
  }
  return consumed._4_4_;
}

Assistant:

static CURLcode cw_out_do_write(struct cw_out_ctx *ctx,
                                struct Curl_easy *data,
                                cw_out_type otype,
                                bool flush_all,
                                const char *buf, size_t blen)
{
  CURLcode result = CURLE_OK;

  /* if we have buffered data and it is a different type than what
   * we are writing now, try to flush all */
  if(ctx->buf && ctx->buf->type != otype) {
    result = cw_out_flush_chain(ctx, data, &ctx->buf, TRUE);
    if(result)
      goto out;
  }

  if(ctx->buf) {
    /* still have buffered data, append and flush */
    result = cw_out_append(ctx, otype, buf, blen);
    if(result)
      return result;
    result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
    if(result)
      goto out;
  }
  else {
    /* nothing buffered, try direct write */
    size_t consumed;
    result = cw_out_ptr_flush(ctx, data, otype, flush_all,
                              buf, blen, &consumed);
    if(result)
      return result;
    if(consumed < blen) {
      /* did not write all, append the rest */
      result = cw_out_append(ctx, otype, buf + consumed, blen - consumed);
      if(result)
        goto out;
    }
  }

out:
  if(result) {
    /* We do not want to invoked client callbacks a second time after
     * encountering an error. See issue #13337 */
    ctx->errored = TRUE;
    cw_out_bufs_free(ctx);
  }
  return result;
}